

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::startModule(SymbolData *this,AssemblerFile *file)

{
  long lVar1;
  pointer pSVar2;
  long lVar3;
  SymDataModule module;
  
  pSVar2 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar1 = (long)(this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  lVar3 = 0;
  while( true ) {
    if (lVar1 / 0x68 == lVar3) {
      module.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &module.data._M_t._M_impl.super__Rb_tree_header._M_header;
      module.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      module.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      module.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      module.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      module.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      module.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      module.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      module.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      module.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      module.file = file;
      module.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           module.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<SymDataModule,_std::allocator<SymDataModule>_>::push_back(&this->modules,&module);
      this->currentModule =
           (int)(((long)(this->modules).
                        super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->modules).
                       super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x68) + -1;
      SymDataModule::~SymDataModule(&module);
      return;
    }
    if (pSVar2->file == file) break;
    lVar3 = lVar3 + 1;
    pSVar2 = pSVar2 + 1;
  }
  this->currentModule = (int)lVar3;
  return;
}

Assistant:

void SymbolData::startModule(AssemblerFile* file)
{
	for (size_t i = 0; i < modules.size(); i++)
	{
		if (modules[i].file == file)
		{
			currentModule = (int)i;
			return;
		}
	}

	SymDataModule module;
	module.file = file;
	modules.push_back(module);
	currentModule = (int)modules.size()-1;
}